

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.hpp
# Opt level: O1

void __thiscall
ableton::link::
Measurement<ableton::platforms::asio::AsioService,ableton::platforms::linux::Clock<1>,ableton::discovery::Socket<512ul>,ableton::util::NullLog>
::Impl::
sendPing<ableton::discovery::Payload<ableton::link::HostTime,ableton::discovery::Payload<ableton::link::PrevGHostTime,ableton::discovery::Payload<>>>>
          (Impl *this,endpoint *to,
          Payload<ableton::link::HostTime,_ableton::discovery::Payload<ableton::link::PrevGHostTime,_ableton::discovery::Payload<>_>_>
          *payload)

{
  uchar *puVar1;
  int in_R8D;
  MessageBuffer buffer;
  uchar local_218 [512];
  
  puVar1 = v1::detail::
           encodeMessage<ableton::discovery::Payload<ableton::link::HostTime,ableton::discovery::Payload<ableton::link::PrevGHostTime,ableton::discovery::Payload<>>>,unsigned_char*>
                     ('\x01',payload,local_218);
  discovery::Socket<512UL>::send
            (*(Socket<512UL> **)(this + 0x10),(int)local_218,puVar1 + -(long)local_218,(size_t)to,
             in_R8D);
  return;
}

Assistant:

void sendPing(asio::ip::udp::endpoint to, const Payload& payload)
    {
      v1::MessageBuffer buffer;
      const auto msgBegin = std::begin(buffer);
      const auto msgEnd = v1::pingMessage(payload, msgBegin);
      const auto numBytes = static_cast<size_t>(std::distance(msgBegin, msgEnd));

      try
      {
        mpSocket->send(buffer.data(), numBytes, to);
      }
      catch (const std::runtime_error& err)
      {
        info(*mLog) << "Failed to send Ping to " << to.address().to_string() << ": "
                    << err.what();
      }
    }